

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT<std::complex<double>>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  TPZCompMesh *this;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  TPZFMatrix<std::complex<double>_> *bRow;
  pair<TPZCompMesh_*,_long> *ppVar6;
  TPZFMatrix<std::complex<double>_> *this_00;
  TPZConnect *this_01;
  int64_t iVar7;
  complex<double> *pcVar8;
  TPZCompMesh *in_RSI;
  TPZSubCompMesh *sub;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  int64_t pos;
  complex<double> val;
  int idf;
  int64_t seqnumMF;
  TPZConnect *conMF;
  int blsize;
  int64_t seqnum;
  TPZConnect *con;
  int64_t atomicindexconnect;
  TPZBlock *block;
  TPZFMatrix<std::complex<double>_> *atomic_mesh_sol;
  TPZCompMesh *atomic_mesh;
  int64_t connect;
  TPZFMatrix<std::complex<double>_> *solMF;
  TPZBlock *blockMF;
  int64_t nconnect;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  size_t in_stack_000002d8;
  char *in_stack_000002e0;
  long in_stack_fffffffffffffeb8;
  TPZCompMesh *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffed8;
  TPZBlock *in_stack_fffffffffffffee0;
  TPZCompMesh *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> *in_stack_fffffffffffffef8;
  TPZCompMesh *in_stack_ffffffffffffff00;
  long local_d8;
  int local_ac;
  int64_t local_60;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_30;
  TPZCompMesh *local_10;
  
  local_10 = in_RSI;
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::TPZVec(&local_30);
  ComputeAtomicIndexes(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  iVar5 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::size(&local_30);
  TPZCompMesh::Block(local_10);
  TPZCompMesh::Solution(local_10);
  bRow = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                   ((TPZSolutionMatrix *)in_stack_fffffffffffffec0);
  for (local_60 = 0; local_60 < iVar5; local_60 = local_60 + 1) {
    ppVar6 = TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
    this = ppVar6->first;
    if (this != (TPZCompMesh *)0x0) {
      TPZCompMesh::Solution(this);
      this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                          ((TPZSolutionMatrix *)in_stack_fffffffffffffec0);
      TPZCompMesh::Block(this);
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::operator[](&local_30,local_60);
      TPZCompMesh::ConnectVec(this);
      this_01 = TPZChunkVector<TPZConnect,_10>::operator[]
                          ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffee0,
                           (int64_t)in_stack_fffffffffffffed8);
      iVar7 = TPZConnect::SequenceNumber(this_01);
      if (iVar7 < 0) {
        pzinternal::DebugStopImpl(in_stack_000002e0,in_stack_000002d8);
      }
      iVar3 = TPZBlock::Size((TPZBlock *)in_stack_fffffffffffffec0,
                             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      in_stack_fffffffffffffef4 = iVar3;
      TPZCompMesh::ConnectVec(local_10);
      in_stack_fffffffffffffee8 =
           (TPZCompMesh *)
           TPZChunkVector<TPZConnect,_10>::operator[]
                     ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffee0,
                      (int64_t)in_stack_fffffffffffffed8);
      iVar7 = TPZConnect::SequenceNumber((TPZConnect *)in_stack_fffffffffffffee8);
      if (iVar7 < 0) {
        pzinternal::DebugStopImpl(in_stack_000002e0,in_stack_000002d8);
      }
      for (local_ac = 0; local_ac < iVar3; local_ac = local_ac + 1) {
        in_stack_fffffffffffffed8 = bRow;
        in_stack_fffffffffffffee0 =
             (TPZBlock *)
             TPZBlock::Index(in_stack_fffffffffffffee0,(int64_t)bRow,
                             (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                           (in_stack_fffffffffffffed8,(int64_t)in_stack_fffffffffffffee0);
        uVar1 = *(undefined8 *)pcVar8->_M_value;
        uVar2 = *(undefined8 *)(pcVar8->_M_value + 8);
        iVar4 = TPZBlock::Position((TPZBlock *)in_stack_fffffffffffffec0,
                                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()(this_00,(long)iVar4 + (long)local_ac)
        ;
        *(undefined8 *)pcVar8->_M_value = uVar1;
        *(undefined8 *)(pcVar8->_M_value + 8) = uVar2;
      }
    }
  }
  iVar5 = TPZCompMesh::NElements((TPZCompMesh *)0x1e43e63);
  for (local_d8 = 0; local_d8 < iVar5; local_d8 = local_d8 + 1) {
    in_stack_fffffffffffffec0 =
         (TPZCompMesh *)TPZCompMesh::Element(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (in_stack_fffffffffffffec0 == (TPZCompMesh *)0x0) {
      in_stack_fffffffffffffeb8 = 0;
    }
    else {
      in_stack_fffffffffffffeb8 =
           __dynamic_cast(in_stack_fffffffffffffec0,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                          0x918);
    }
    if (in_stack_fffffffffffffeb8 != 0) {
      TransferFromMultiPhysics
                ((TPZVec<TPZCompMesh_*> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
    }
  }
  TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec
            ((TPZVec<std::pair<TPZCompMesh_*,_long>_> *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        //TODOCOMPLEX
        if(!atomic_mesh) continue;
        TPZFMatrix<TVar> &atomic_mesh_sol = atomic_mesh->Solution();
        TPZBlock &block = atomic_mesh->Block();
        int64_t atomicindexconnect = indexes[connect].second;
        TPZConnect &con = atomic_mesh->ConnectVec()[atomicindexconnect];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            TVar val = solMF(blockMF.Index(seqnumMF, idf));
            int64_t pos = block.Position(seqnum);
            atomic_mesh_sol(pos+idf) = val;
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMultiPhysics(cmeshVec, sub);
        }
    }
}